

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void __thiscall rw::Image::unpalettize(Image *this,bool forceAlpha)

{
  bool32 bVar1;
  uint8 *puVar2;
  uint8 *puVar3;
  int iVar4;
  uint8 *puVar5;
  uint uVar6;
  void *__ptr;
  int iVar7;
  long lVar8;
  uint8 *puVar9;
  int iVar10;
  
  if (this->depth < 9) {
    if (forceAlpha) {
      uVar6 = 0x20;
      bVar1 = 1;
    }
    else {
      bVar1 = hasAlpha(this);
      uVar6 = bVar1 * 8 + 0x18;
    }
    iVar10 = (int)(this->width * uVar6) >> 3;
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 714"
    ;
    __ptr = (void *)0x30018;
    puVar2 = (uint8 *)(*DAT_00149de8)((long)this->height * (long)iVar10);
    iVar7 = this->height;
    if (0 < iVar7) {
      puVar3 = this->pixels;
      __ptr = (void *)(ulong)(uint)this->width;
      iVar4 = 0;
      puVar5 = puVar2;
      do {
        if (0 < (int)__ptr) {
          lVar8 = 0;
          puVar9 = puVar5;
          do {
            *puVar9 = this->palette[(ulong)puVar3[lVar8] * 4];
            puVar9[1] = this->palette[(ulong)puVar3[lVar8] * 4 + 1];
            puVar9[2] = this->palette[(ulong)puVar3[lVar8] * 4 + 2];
            if ((char)bVar1 == '\0') {
              puVar9 = puVar9 + 3;
            }
            else {
              puVar9[3] = this->palette[(ulong)puVar3[lVar8] * 4 + 3];
              puVar9 = puVar9 + 4;
            }
            __ptr = (void *)(ulong)(uint)this->width;
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 < this->width);
          iVar7 = this->height;
        }
        puVar3 = puVar3 + this->stride;
        puVar5 = puVar5 + iVar10;
        iVar4 = iVar4 + 1;
      } while (iVar4 < iVar7);
    }
    free(this,__ptr);
    this->depth = uVar6;
    this->bpp = uVar6 >> 3;
    this->stride = iVar10;
    this->pixels = puVar2;
    *(byte *)&this->flags = (byte)this->flags | 1;
  }
  return;
}

Assistant:

void
Image::unpalettize(bool forceAlpha)
{
	if(this->depth > 8)
		return;
	assert(this->pixels);
	assert(this->palette);

	int32 ndepth = (forceAlpha || this->hasAlpha()) ? 32 : 24;
	int32 nstride = this->width*ndepth/8;
	uint8 *npixels = rwNewT(uint8, nstride*this->height, MEMDUR_EVENT | ID_IMAGE);

	uint8 *line = this->pixels;
	uint8 *nline = npixels;
	uint8 *p, *np;
	for(int32 y = 0; y < this->height; y++){
		p = line;
		np = nline;
		for(int32 x = 0; x < this->width; x++){
			np[0] = this->palette[*p*4+0];
			np[1] = this->palette[*p*4+1];
			np[2] = this->palette[*p*4+2];
			np += 3;
			if(ndepth == 32)
				*np++ = this->palette[*p*4+3];
			p++;
		}
		line += this->stride;
		nline += nstride;
	}
	this->free();
	this->depth = ndepth;
	this->bpp = ndepth < 8 ? 1 : ndepth/8;
	this->stride = nstride;
	this->setPixels(npixels);
}